

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParseFieldValueFromString
          (Parser *this,string *input,FieldDescriptor *field,Message *output)

{
  bool bVar1;
  int size;
  void *data;
  Descriptor *root_message_type;
  undefined1 local_158 [8];
  ParserImpl parser;
  ArrayInputStream input_stream;
  Message *output_local;
  FieldDescriptor *field_local;
  string *input_local;
  Parser *this_local;
  
  data = (void *)std::__cxx11::string::data();
  size = std::__cxx11::string::size();
  io::ArrayInputStream::ArrayInputStream((ArrayInputStream *)&parser.allow_partial_,data,size,-1);
  root_message_type = Message::GetDescriptor(output);
  ParserImpl::ParserImpl
            ((ParserImpl *)local_158,root_message_type,(ZeroCopyInputStream *)&parser.allow_partial_
             ,this->error_collector_,this->finder_,this->parse_info_tree_,ALLOW_SINGULAR_OVERWRITES,
             (bool)(this->allow_case_insensitive_field_ & 1),(bool)(this->allow_unknown_field_ & 1),
             (bool)(this->allow_unknown_enum_ & 1),(bool)(this->allow_field_number_ & 1),
             (bool)(this->allow_relaxed_whitespace_ & 1),(bool)(this->allow_partial_ & 1));
  bVar1 = ParserImpl::ParseField((ParserImpl *)local_158,field,output);
  ParserImpl::~ParserImpl((ParserImpl *)local_158);
  io::ArrayInputStream::~ArrayInputStream((ArrayInputStream *)&parser.allow_partial_);
  return bVar1;
}

Assistant:

bool TextFormat::Parser::ParseFieldValueFromString(
    const string& input,
    const FieldDescriptor* field,
    Message* output) {
  io::ArrayInputStream input_stream(input.data(), input.size());
  ParserImpl parser(output->GetDescriptor(), &input_stream, error_collector_,
                    finder_, parse_info_tree_,
                    ParserImpl::ALLOW_SINGULAR_OVERWRITES,
                    allow_case_insensitive_field_, allow_unknown_field_,
                    allow_unknown_enum_, allow_field_number_,
                    allow_relaxed_whitespace_, allow_partial_);
  return parser.ParseField(field, output);
}